

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O1

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
          (spvtools *this,IRContext **args,Op *args_1,uint *args_2,uint *args_3,
          initializer_list<spvtools::opt::Operand> *args_4)

{
  Op op;
  uint32_t ty_id;
  uint32_t res_id;
  IRContext *c;
  Instruction *this_00;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = (Instruction *)operator_new(0x70);
  c = *args;
  op = *args_1;
  ty_id = *args_2;
  res_id = *args_3;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             args_4->_M_array,args_4->_M_array + args_4->_M_len);
  opt::Instruction::Instruction(this_00,c,op,ty_id,res_id,(OperandList *)&local_48);
  *(Instruction **)this = this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}